

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall libcellml::Annotator::AnnotatorImpl::doSetImportSourceIds(AnnotatorImpl *this)

{
  size_type sVar1;
  AnyCellmlElementPtr *item;
  AnyCellmlElementPtr *importSource;
  AnyCellmlElementPtr entry;
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  importSources;
  shared_ptr<libcellml::Model> model;
  string id;
  undefined8 *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
  *local_c8;
  AnnotatorImpl *local_c0;
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  local_b8;
  undefined1 local_a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
  local_80;
  string local_50;
  
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10),
             &this->mModel);
  std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10));
  getAllImportSources(&local_b8,(ModelConstPtr *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80.first._M_string_length);
  local_c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
              *)&this->mIdList;
  local_c0 = this;
  for (importSource = (AnyCellmlElementPtr *)
                      local_b8.
                      super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      importSource !=
      (AnyCellmlElementPtr *)
      local_b8.
      super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; importSource = importSource + 1) {
    Entity::id_abi_cxx11_
              (&local_80.first,
               (Entity *)
               (importSource->
               super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    sVar1 = local_80.first._M_string_length;
    std::__cxx11::string::~string((string *)&local_80);
    if ((pointer)sVar1 == (pointer)0x0) {
      makeUniqueId_abi_cxx11_(&local_50,local_c0);
      Entity::setId((Entity *)
                    (importSource->
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr,&local_50);
      AnyCellmlElement::AnyCellmlElementImpl::create();
      item = importSource;
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                ((AnyCellmlElementImpl *)*local_d8,(ImportSourcePtr *)importSource);
      convertToWeak((AnnotatorImpl *)local_a0,item);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<libcellml::AnyCellmlElement>,_true>
                (&local_80,&local_50,(shared_ptr<libcellml::AnyCellmlElement> *)local_a0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
      ::
      _M_emplace_equal<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::AnyCellmlElement>>>
                (local_c8,&local_80);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
      ::~pair(&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ::~vector(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  return;
}

Assistant:

void Annotator::AnnotatorImpl::doSetImportSourceIds()
{
    // Import items.
    auto model = mModel.lock();
    auto importSources = getAllImportSources(model);
    for (auto &importSource : importSources) {
        if (importSource->id().empty()) {
            auto id = makeUniqueId();
            importSource->setId(id);
            auto entry = AnyCellmlElement::AnyCellmlElementImpl::create();
            entry->mPimpl->setImportSource(importSource);
            mIdList.insert(std::make_pair(id, convertToWeak(entry)));
        }
    }
}